

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O1

Solution * Genetic::generate_child(Solution *p1,Solution *p2)

{
  size_t *psVar1;
  Solution *pSVar2;
  undefined8 *****pppppuVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 *******pppppppuVar4;
  bool bVar5;
  int iVar6;
  Solution *s;
  _List_node_base *p_Var7;
  Vehicle *pVVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  undefined8 *******pppppppuVar11;
  undefined8 ******ppppppuVar12;
  iterator __end1;
  undefined8 ******ppppppuVar13;
  Vehicle *nv;
  int ec;
  Vehicle *local_58;
  undefined8 *******local_50;
  undefined8 *******local_48;
  ulong local_40;
  int local_34;
  
  s = (Solution *)operator_new(0x20);
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)s;
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)s;
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size = 0;
  local_50 = &local_50;
  local_40 = 0;
  local_48 = local_50;
  for (pSVar2 = (Solution *)
                (p1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pSVar2 != p1;
      pSVar2 = (Solution *)
               (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    p_Var9 = (_List_node_base *)
             (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
             _M_node._M_size;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = p_Var9;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    local_40 = local_40 + 1;
  }
  for (pSVar2 = (Solution *)
                (p2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pSVar2 != p2;
      pSVar2 = (Solution *)
               (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    p_Var9 = (_List_node_base *)
             (pSVar2->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
             _M_node._M_size;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = p_Var9;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    local_40 = local_40 + 1;
  }
  while (pppppppuVar11 = local_50, (undefined8 ********)local_50 != &local_50) {
    iVar6 = rand();
    uVar10 = (ulong)(long)iVar6 % local_40;
    if ((long)uVar10 < 1) {
      for (; uVar10 != 0; uVar10 = uVar10 + 1) {
        pppppppuVar11 = (undefined8 *******)pppppppuVar11[1];
      }
    }
    else {
      do {
        pppppppuVar11 = (undefined8 *******)*pppppppuVar11;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    ppppppuVar13 = pppppppuVar11[2];
    local_40 = local_40 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pppppppuVar11);
    pVVar8 = (Vehicle *)operator_new(0x28);
    Vehicle::Vehicle(pVVar8,s);
    local_58 = pVVar8;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_58;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar1 = &(s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    ppppppuVar12 = (undefined8 ******)ppppppuVar13[1];
    ppppppuVar13 = ppppppuVar13 + 1;
    if (ppppppuVar12 != ppppppuVar13) {
      iVar6 = 0;
      do {
        pppppuVar3 = ppppppuVar12[2];
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppppppuVar12[3];
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        bVar5 = Solution::has_node(s,(Point *)*pppppuVar3);
        if (!bVar5) {
          local_34 = 0;
          Vehicle::add_node(local_58,(Point *)*pppppuVar3,iVar6,&local_34);
          iVar6 = iVar6 + 1;
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        ppppppuVar12 = (undefined8 ******)*ppppppuVar12;
      } while (ppppppuVar12 != ppppppuVar13);
    }
    if (((local_58->nodes).
         super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
         ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_58->nodes) &&
       (std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::remove
                  ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)s,(char *)&local_58),
       pVVar8 = local_58, local_58 != (Vehicle *)0x0)) {
      std::__cxx11::
      _List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
      _M_clear(&(local_58->nodes).
                super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
              );
      operator_delete(pVVar8);
    }
  }
  Solution::total_weight(s);
  pppppppuVar11 = local_50;
  while ((undefined8 ********)pppppppuVar11 != &local_50) {
    pppppppuVar4 = (undefined8 *******)*pppppppuVar11;
    operator_delete(pppppppuVar11);
    pppppppuVar11 = pppppppuVar4;
  }
  return s;
}

Assistant:

Solution* Genetic::generate_child(Solution* p1, Solution* p2)
{
	auto solution = new Solution;
	//Route-Based Crossover
	std::list<Vehicle*> vehicle_pool;
	for (auto vehicle : p1->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}
	for (auto vehicle : p2->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}

	auto total_nodes = Utils::raw_rows.size() - 1;

	while (!vehicle_pool.empty())
	{
		auto it = vehicle_pool.begin();
		std::advance(it, rand() % vehicle_pool.size());
		auto pool = *it;
		vehicle_pool.erase(it);

		auto nv = new Vehicle(solution);
		solution->vehicles.push_back(nv);
		auto pos = 0;
		for (auto node : pool->nodes)
		{
			if (!solution->has_node(node->p))
			{
				auto ec = 0;
				nv->add_node(node->p, pos++, ec);
				total_nodes--;
			}
		}
		if (nv->nodes.empty())
		{
			solution->vehicles.remove(nv);
			delete nv;
		}
	}

	solution->total_weight();
	return solution;
}